

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void wr_messages(void)

{
  uint16_t uVar1;
  uint16_t v;
  char *str;
  uint16_t age;
  
  uVar1 = messages_num();
  v = 0x50;
  age = 0x50;
  if (uVar1 < 0x50) {
    v = uVar1;
    age = uVar1;
  }
  while (wr_u16b(v), 0 < (short)age) {
    age = age - 1;
    str = message_str(age);
    wr_string(str);
    v = message_type(age);
  }
  return;
}

Assistant:

void wr_messages(void)
{
	int16_t i;
	uint16_t num;

	num = messages_num();
	if (num > 80) num = 80;
	wr_u16b(num);

	/* Dump the messages (oldest first!) */
	for (i = num - 1; i >= 0; i--) {
		wr_string(message_str(i));
		wr_u16b(message_type(i));
	}
}